

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  undefined1 uVar2;
  SQInteger SVar3;
  SQObjectPtr *pSVar4;
  long in_RDX;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *unaff_retaddr;
  SQVM *in_stack_00000008;
  SQObjectPtr res;
  SQObjectPtr *key;
  SQObjectPtr *self;
  SQChar *in_stack_ffffffffffffff98;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  SQVM *this;
  undefined7 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectPtr **in_stack_ffffffffffffffc0;
  SQObjectType in_stack_ffffffffffffffcc;
  SQWeakRef *in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQObjectPtr *in_stack_fffffffffffffff8;
  SQUnsignedInteger SVar5;
  
  SVar3 = sq_gettop(in_RDI);
  if (SVar3 < 2) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    SVar5 = 0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    if (bVar1) {
      pSVar4 = SQVM::GetUp(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
      if ((pSVar4->super_SQObject)._type == OT_NULL) {
        SVar5 = sq_throwerror(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        this = (SQVM *)&stack0xffffffffffffffc0;
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)this);
        uVar2 = SQVM::DeleteSlot(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                                 (SQObjectPtr *)in_RDI);
        if ((bool)uVar2) {
          if (in_RDX == 0) {
            SQVM::Pop((SQVM *)0x117239);
          }
          else {
            SQVM::GetUp(this,(SQInteger)in_stack_ffffffffffffff98);
            SQObjectPtr::operator=
                      ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (SQObjectPtr *)CONCAT17(uVar2,in_stack_ffffffffffffffa8));
          }
          SVar5 = 0;
        }
        else {
          SQVM::Pop((SQVM *)0x1171cf);
          SVar5 = 0xffffffffffffffff;
        }
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
      }
    }
    else {
      SVar5 = 0xffffffffffffffff;
    }
  }
  return SVar5;
}

Assistant:

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
    SQObjectPtr res;
    if(!v->DeleteSlot(*self, key, res)){
        v->Pop();
        return SQ_ERROR;
    }
    if(pushval) v->GetUp(-1) = res;
    else v->Pop();
    return SQ_OK;
}